

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CGL::GLScene::Mesh::draw_vertex(Mesh *this,Vertex *v)

{
  HalfedgeElement *in_RSI;
  Mesh *in_RDI;
  DrawStyle *unaff_retaddr;
  
  get_draw_style(in_RDI,in_RSI);
  DrawStyle::style_vertex(unaff_retaddr);
  glBegin(0);
  glVertex3d(in_RSI[2]._vptr_HalfedgeElement,in_RSI[3]._vptr_HalfedgeElement,
             in_RSI[4]._vptr_HalfedgeElement);
  glEnd();
  get_draw_style(in_RDI,in_RSI);
  DrawStyle::style_reset((DrawStyle *)0x13025e);
  return;
}

Assistant:

void Mesh::draw_vertex(const Vertex *v) const {
  get_draw_style(v)->style_vertex();
  glBegin(GL_POINTS);
  glVertex3d(v->position.x, v->position.y, v->position.z);
  glEnd();
  get_draw_style(v)->style_reset();
}